

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Population.cpp
# Opt level: O0

void __thiscall Population::evolve(Population *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  mt19937 *pmVar4;
  DNA *dna1_00;
  reference pDVar5;
  result_type_conflict2 rVar6;
  DNA *dna;
  iterator __end1;
  iterator __begin1;
  vector<DNA,_std::allocator<DNA>_> *__range1;
  undefined1 local_b0 [4];
  int fitness;
  undefined1 local_88 [8];
  DNA newDNA;
  DNA *dna2;
  DNA *dna1;
  int i;
  undefined1 local_40 [8];
  uniform_real_distribution<double> real_distribution;
  double invSum;
  vector<DNA,_std::allocator<DNA>_> new_population;
  Population *this_local;
  
  new_population.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::vector<DNA,_std::allocator<DNA>_>::vector((vector<DNA,_std::allocator<DNA>_> *)&invSum);
  real_distribution._M_param._M_b = 0.0;
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)local_40,0.0,1.0);
  for (dna1._0_4_ = 0; sVar3 = std::vector<DNA,_std::allocator<DNA>_>::size(&this->population_),
      (ulong)(long)(int)dna1 < sVar3; dna1._0_4_ = (int)dna1 + 1) {
    pmVar4 = random_engine();
    rVar6 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)local_40,pmVar4);
    dna1_00 = GetDNAWithProbability(this,rVar6);
    pmVar4 = random_engine();
    rVar6 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)local_40,pmVar4);
    newDNA.likelihood = (double)GetDNAWithProbability(this,rVar6);
    crossover((DNA *)local_b0,this,dna1_00,(DNA *)newDNA.likelihood);
    mutation((DNA *)local_88,this,(DNA *)local_b0);
    DNA::~DNA((DNA *)local_b0);
    iVar2 = DNA::calcFitness((DNA *)local_88,&this->diophantine_);
    if (iVar2 != 0) {
      real_distribution._M_param._M_b = real_distribution._M_param._M_b + 1.0 / (double)iVar2;
      std::vector<DNA,_std::allocator<DNA>_>::push_back
                ((vector<DNA,_std::allocator<DNA>_> *)&invSum,(value_type *)local_88);
    }
    else {
      this->answerReady = true;
      std::vector<int,_std::allocator<int>_>::operator=
                (&this->answer,(vector<int,_std::allocator<int>_> *)local_88);
    }
    DNA::~DNA((DNA *)local_88);
    if (iVar2 == 0) break;
  }
  std::vector<DNA,_std::allocator<DNA>_>::operator=
            (&this->population_,(vector<DNA,_std::allocator<DNA>_> *)&invSum);
  __end1 = std::vector<DNA,_std::allocator<DNA>_>::begin(&this->population_);
  dna = (DNA *)std::vector<DNA,_std::allocator<DNA>_>::end(&this->population_);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<DNA_*,_std::vector<DNA,_std::allocator<DNA>_>_>
                                     *)&dna), bVar1) {
    pDVar5 = __gnu_cxx::__normal_iterator<DNA_*,_std::vector<DNA,_std::allocator<DNA>_>_>::operator*
                       (&__end1);
    pDVar5->likelihood = (1.0 / (double)pDVar5->fitness) / real_distribution._M_param._M_b;
    __gnu_cxx::__normal_iterator<DNA_*,_std::vector<DNA,_std::allocator<DNA>_>_>::operator++
              (&__end1);
  }
  std::vector<DNA,_std::allocator<DNA>_>::~vector((vector<DNA,_std::allocator<DNA>_> *)&invSum);
  return;
}

Assistant:

void Population::evolve() {
    vector<DNA> new_population;
    double invSum = 0.0f;
    uniform_real_distribution<double> real_distribution(0.0, 1.0);

    for (int i = 0; i < population_.size(); ++i) {

        const DNA& dna1 = GetDNAWithProbability(real_distribution(random_engine()));
        const DNA& dna2 = GetDNAWithProbability(real_distribution(random_engine()));
        DNA newDNA = mutation(crossover(dna1, dna2));
        int fitness = newDNA.calcFitness(diophantine_);
        if (fitness == 0) {
            answerReady = true;
            answer = newDNA.genes;
            break;
        }
        invSum += 1.0 / static_cast<double>(fitness);
        new_population.push_back(newDNA);
    }

    population_ = move(new_population);
    for (DNA& dna : population_) {
        dna.likelihood = (1.0 / static_cast<double>(dna.fitness)) / invSum;
    }
}